

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void __thiscall jpgd::jpeg_decoder::H1V2ConvertFiltered(jpeg_decoder *this)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint8 uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint8 *local_78;
  uint8 *local_70;
  
  uVar18 = this->m_image_y_size - this->m_total_lines_left;
  uVar17 = (this->m_image_y_size >> 1) - 1;
  puVar6 = this->m_pScan_line_0;
  uVar14 = (int)(uVar18 - 1) >> 1;
  if ((int)(uVar14 + 1) < (int)uVar17) {
    uVar17 = uVar14 + 1;
  }
  local_78 = this->m_pSample_buf;
  local_70 = local_78;
  if ((-1 < (int)uVar14) &&
     (((uVar16 = uVar18 & 0xf, uVar16 == 0xf || (uVar16 == 0)) && (1 < this->m_total_lines_left))))
  {
    if ((int)uVar18 < 1) {
      __assert_fail("y > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x6be,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    if (this->m_sample_buf_prev_valid == false) {
      __assert_fail("m_sample_buf_prev_valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/jpgd.cpp"
                    ,0x6bf,"void jpgd::jpeg_decoder::H1V2ConvertFiltered()");
    }
    local_70 = this->m_pSample_buf_prev;
    if (uVar16 == 0xf) {
      local_78 = local_70;
    }
  }
  iVar1 = (uVar18 & 1) * 2 + 1;
  iVar8 = (uint)((uVar18 & 1) == 0) * 2 + 1;
  uVar16 = 0;
  for (lVar11 = 0; (int)(uint)lVar11 < this->m_image_x_size; lVar11 = lVar11 + 1) {
    uVar15 = (uint)lVar11 & 7 | uVar16 & 0xffffff00;
    iVar9 = check_sample_buf_ofs(this,uVar15 | (uVar18 & 0xf) << 3);
    bVar2 = local_78[iVar9];
    uVar19 = (uVar14 & 7) << 3 | uVar15;
    iVar9 = check_sample_buf_ofs(this,uVar19 | 0x80);
    bVar3 = local_70[iVar9];
    iVar9 = check_sample_buf_ofs(this,uVar19 | 0xc0);
    bVar4 = local_70[iVar9];
    uVar15 = uVar15 | (uVar17 & 7) << 3;
    puVar7 = this->m_pSample_buf;
    iVar9 = check_sample_buf_ofs(this,uVar15 | 0x80);
    bVar5 = puVar7[iVar9];
    puVar7 = this->m_pSample_buf;
    iVar9 = check_sample_buf_ofs(this,uVar15 | 0xc0);
    uVar13 = (ulong)((uint)bVar4 * iVar1 + (uint)puVar7[iVar9] * iVar8 + 2 & 0xfffffffc);
    uVar10 = (ulong)((uint)bVar5 * iVar8 + (uint)bVar3 * iVar1 + 2 & 0xfffffffc);
    iVar9 = *(int *)((long)this->m_crr + uVar13) + (uint)bVar2;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    uVar12 = (uint8)iVar9;
    if (0xfe < iVar9) {
      uVar12 = 0xff;
    }
    iVar9 = (*(int *)((long)this->m_cbg + uVar10) + *(int *)((long)this->m_crg + uVar13) >> 0x10) +
            (uint)bVar2;
    iVar20 = (uint)bVar2 + *(int *)((long)this->m_cbb + uVar10);
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (0xfe < iVar9) {
      iVar9 = 0xff;
    }
    puVar6[lVar11 * 4] = uVar12;
    if (iVar20 < 1) {
      iVar20 = 0;
    }
    puVar6[lVar11 * 4 + 1] = (uint8)iVar9;
    uVar12 = (uint8)iVar20;
    if (0xfe < iVar20) {
      uVar12 = 0xff;
    }
    puVar6[lVar11 * 4 + 2] = uVar12;
    puVar6[lVar11 * 4 + 3] = 0xff;
    uVar16 = uVar16 + 0x20;
  }
  return;
}

Assistant:

void jpeg_decoder::H1V2ConvertFiltered()
	{
		const uint BLOCKS_PER_MCU = 4;
		int y = m_image_y_size - m_total_lines_left;
		int row = y & 15;

		const int half_image_y_size = (m_image_y_size >> 1) - 1;

		uint8* d0 = m_pScan_line_0;

		const int w0 = (row & 1) ? 3 : 1;
		const int w1 = (row & 1) ? 1 : 3;

		int c_y0 = (y - 1) >> 1;
		int c_y1 = JPGD_MIN(c_y0 + 1, half_image_y_size);

		const uint8_t* p_YSamples = m_pSample_buf;
		const uint8_t* p_C0Samples = m_pSample_buf;
		if ((c_y0 >= 0) && (((row & 15) == 0) || ((row & 15) == 15)) && (m_total_lines_left > 1))
		{
			assert(y > 0);
			assert(m_sample_buf_prev_valid);

			if ((row & 15) == 15)
				p_YSamples = m_pSample_buf_prev;

			p_C0Samples = m_pSample_buf_prev;
		}

		const int y_sample_base_ofs = ((row & 8) ? 64 : 0) + (row & 7) * 8;
		const int y0_base = (c_y0 & 7) * 8 + 128;
		const int y1_base = (c_y1 & 7) * 8 + 128;

		for (int x = 0; x < m_image_x_size; x++)
		{
			const int base_ofs = (x >> 3) * BLOCKS_PER_MCU * 64 + (x & 7);

			int y_sample = p_YSamples[check_sample_buf_ofs(base_ofs + y_sample_base_ofs)];

			int a = base_ofs + y0_base;
			int cb0_sample = p_C0Samples[check_sample_buf_ofs(a)];
			int cr0_sample = p_C0Samples[check_sample_buf_ofs(a + 64)];

			int b = base_ofs + y1_base;
			int cb1_sample = m_pSample_buf[check_sample_buf_ofs(b)];
			int cr1_sample = m_pSample_buf[check_sample_buf_ofs(b + 64)];

			int cb = (cb0_sample * w0 + cb1_sample * w1 + 2) >> 2;
			int cr = (cr0_sample * w0 + cr1_sample * w1 + 2) >> 2;

			int rc = m_crr[cr];
			int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
			int bc = m_cbb[cb];

			d0[0] = clamp(y_sample + rc);
			d0[1] = clamp(y_sample + gc);
			d0[2] = clamp(y_sample + bc);
			d0[3] = 255;

			d0 += 4;
		}
	}